

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Request<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,_capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>
* __thiscall
capnp::Capability::Client::
newCall<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>
          (Request<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,_capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>
           *__return_storage_ptr__,Client *this,uint64_t interfaceId,uint16_t methodId,
          Maybe<capnp::MessageSize> *sizeHint,CallHints hints)

{
  Builder builder;
  ClientHook *pCVar1;
  Own<capnp::RequestHook,_std::nullptr_t> *hook;
  BuilderFor<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams> local_b8;
  CallHints local_7a;
  Maybe<capnp::MessageSize> local_78;
  undefined1 local_60 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  Client *this_local;
  CallHints hints_local;
  
  typeless.hook.ptr = (RequestHook *)sizeHint;
  pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(&this->hook);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_78,sizeHint);
  local_7a = hints;
  (**pCVar1->_vptr_ClientHook)
            (local_60,pCVar1,interfaceId,(ulong)methodId,&local_78,(ulong)(ushort)hints);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_78);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams>
            (&local_b8,(Builder *)local_60);
  hook = kj::mv<kj::Own<capnp::RequestHook,decltype(nullptr)>>
                   ((Own<capnp::RequestHook,_std::nullptr_t> *)
                    &typeless.super_Builder.builder.pointer);
  builder._builder.capTable = local_b8._builder.capTable;
  builder._builder.segment = local_b8._builder.segment;
  builder._builder.data = local_b8._builder.data;
  builder._builder.pointers = local_b8._builder.pointers;
  builder._builder.dataSize = local_b8._builder.dataSize;
  builder._builder.pointerCount = local_b8._builder.pointerCount;
  builder._builder._38_2_ = local_b8._builder._38_2_;
  Request<capnproto_test::capnp::test::TestKeywordMethods::ReturnParams,_capnproto_test::capnp::test::TestKeywordMethods::ReturnResults>
  ::Request(__return_storage_ptr__,builder,hook);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
            ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

inline Request<Params, Results> Capability::Client::newCall(
    uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint, CallHints hints) {
  auto typeless = hook->newCall(interfaceId, methodId, sizeHint, hints);
  return Request<Params, Results>(typeless.template getAs<Params>(), kj::mv(typeless.hook));
}